

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

String * axl::io::concatFilePath
                   (String *__return_storage_ptr__,String *filePath,StringRef *fileName)

{
  size_t sVar1;
  
  sVar1 = (filePath->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  if (sVar1 == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (filePath,(EVP_PKEY_CTX *)fileName,(EVP_PKEY_CTX *)fileName);
  }
  else {
    if ((filePath->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p[sVar1 - 1] !=
        '/') {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
                (filePath,0xffffffffffffffff,0x2f,1);
    }
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
              (filePath,0xffffffffffffffff,fileName);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,filePath);
  return __return_storage_ptr__;
}

Assistant:

sl::String
concatFilePath(
	sl::String* filePath,
	const sl::StringRef& fileName
) {
	if (filePath->isEmpty()) {
		*filePath = fileName;
		return *filePath;
	}

	char last = (*filePath) [filePath->getLength() - 1];

#if (_AXL_OS_WIN)
	if (last != '\\' && last != '/')
		filePath->append('\\');
#elif (_AXL_OS_POSIX)
	if (last != '/')
		filePath->append('/');
#endif

	filePath->append(fileName);
	return *filePath;
}